

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib510.c
# Opt level: O0

size_t read_callback(void *ptr,size_t size,size_t nmemb,void *userp)

{
  char *__s;
  size_t len;
  char *data;
  WriteThis *pooh;
  void *userp_local;
  size_t nmemb_local;
  size_t size_local;
  void *ptr_local;
  
  if (size * nmemb == 0) {
    ptr_local = (void *)0x0;
  }
  else {
    __s = post[*userp];
    if (__s == (char *)0x0) {
      ptr_local = (void *)0x0;
    }
    else {
      ptr_local = (void *)strlen(__s);
      memcpy(ptr,__s,(size_t)ptr_local);
      *(int *)userp = *userp + 1;
    }
  }
  return (size_t)ptr_local;
}

Assistant:

static size_t read_callback(void *ptr, size_t size, size_t nmemb, void *userp)
{
  struct WriteThis *pooh = (struct WriteThis *)userp;
  const char *data;

  if(size*nmemb < 1)
    return 0;

  data = post[pooh->counter];

  if(data) {
    size_t len = strlen(data);
    memcpy(ptr, data, len);
    pooh->counter++; /* advance pointer */
    return len;
  }
  return 0;                         /* no more data left to deliver */
}